

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::UpdateTransformState(Element *this)

{
  byte *pbVar1;
  UniquePtr<TransformState> *pUVar2;
  float fVar3;
  undefined4 uVar4;
  Vector2f VVar5;
  undefined4 uVar6;
  ElementMeta *pEVar7;
  pointer puVar8;
  RareValues RVar9;
  undefined8 uVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  size_t i;
  Matrix4f *pMVar15;
  ThisType *other;
  TransformPrimitive *p;
  ulong uVar16;
  int i_00;
  TransformState *pTVar17;
  byte bVar18;
  bool bVar19;
  float fVar20;
  Vector2f VVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float local_1d8;
  float fStack_1d4;
  float local_1b8;
  float fStack_1b4;
  TransformPtr transform_ptr;
  Matrix4f perspective;
  Matrix4f matrix;
  undefined1 local_118 [16];
  Vector3<float> local_108;
  ThisType local_f8;
  ThisType local_b0;
  MatrixAType local_70;
  
  if ((this->field_0x17 & 0x60) == 0) {
    return;
  }
  pEVar7 = this->meta;
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  VVar5 = this->absolute_offset;
  VVar21 = Box::GetSize(&this->main_box,Border);
  bVar12 = this->field_0x17;
  bVar19 = false;
  bVar18 = 0;
  local_1b8 = VVar5.x;
  fStack_1b4 = VVar5.y;
  local_1d8 = VVar21.x;
  fStack_1d4 = VVar21.y;
  if ((bVar12 & 0x40) != 0) {
    pTVar17 = (this->transform_state)._M_t.
              super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
              .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
    if (pTVar17 != (TransformState *)0x0) {
      pMVar15 = TransformState::GetLocalPerspective(pTVar17);
      bVar19 = pMVar15 != (Matrix4f *)0x0;
    }
    pUVar2 = &this->transform_state;
    fVar3 = (pEVar7->computed_values).rare.perspective;
    if (fVar3 <= 0.0) {
      pTVar17 = (pUVar2->_M_t).
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      bVar11 = false;
      if (pTVar17 != (TransformState *)0x0) {
        TransformState::SetLocalPerspective(pTVar17,(Matrix4f *)0x0);
        bVar11 = false;
      }
    }
    else {
      RVar9 = (pEVar7->computed_values).rare;
      fVar20 = (pEVar7->computed_values).rare.perspective_origin_x;
      if (((undefined1  [80])RVar9 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        fVar20 = fVar20 * 0.01 * local_1d8;
      }
      fVar24 = (pEVar7->computed_values).rare.perspective_origin_y;
      if (((undefined1  [80])RVar9 & (undefined1  [80])0x20) != (undefined1  [80])0x0) {
        fVar24 = fVar24 * 0.01 * fStack_1d4;
      }
      matrix.vectors[0].z = -(fVar20 + local_1b8) / fVar3;
      matrix.vectors[0].x = 1.0;
      matrix.vectors[0].y = 0.0;
      matrix.vectors[0].w = 0.0;
      local_70.vectors[0].z = -(fStack_1b4 + fVar24) / fVar3;
      local_70.vectors[0].x = 0.0;
      local_70.vectors[0].y = 1.0;
      local_70.vectors[0].w = 0.0;
      local_f8.vectors[0].x = 0.0;
      local_f8.vectors[0].y = 0.0;
      local_f8.vectors[0].z = 1.0;
      local_f8.vectors[0].w = 0.0;
      local_b0.vectors[0].x = 0.0;
      local_b0.vectors[0].y = 0.0;
      local_b0.vectors[0].z = -1.0 / fVar3;
      local_b0.vectors[0].w = 1.0;
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::FromRows
                (&perspective,matrix.vectors,local_70.vectors,local_f8.vectors,local_b0.vectors);
      pTVar17 = (pUVar2->_M_t).
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar17 == (TransformState *)0x0) {
        ::std::make_unique<Rml::TransformState>();
        uVar10 = matrix.vectors[0]._0_8_;
        matrix.vectors[0].x = 0.0;
        matrix.vectors[0].y = 0.0;
        ::std::__uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
        reset((__uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
              pUVar2,(pointer)uVar10);
        ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
        ~unique_ptr((unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
                    &matrix);
        pTVar17 = (pUVar2->_M_t).
                  super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                  .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      }
      bVar11 = TransformState::SetLocalPerspective(pTVar17,&perspective);
    }
    bVar18 = bVar19 != 0.0 < fVar3 | bVar11;
    bVar12 = this->field_0x17 & 0xbf;
    this->field_0x17 = bVar12;
  }
  if ((bVar12 & 0x20) == 0) {
    if (bVar18 == 0) goto LAB_0027f62c;
  }
  else {
    pTVar17 = (this->transform_state)._M_t.
              super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
              .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
    if (pTVar17 == (TransformState *)0x0) {
      bVar19 = false;
    }
    else {
      pMVar15 = TransformState::GetTransform(pTVar17);
      bVar19 = pMVar15 != (Matrix4f *)0x0;
    }
    other = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity();
    Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Matrix4(&perspective,other);
    Style::ComputedValues::transform((ComputedValues *)&transform_ptr);
    i_00 = 0;
    if (transform_ptr.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      bVar11 = false;
    }
    else {
      iVar14 = Transform::GetNumPrimitives
                         (transform_ptr.
                          super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar11 = false;
      for (; iVar14 != i_00; i_00 = i_00 + 1) {
        p = Transform::GetPrimitive
                      (transform_ptr.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,i_00);
        TransformUtilities::ResolveTransform(&matrix,p,this);
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator*=(&perspective,&matrix);
        bVar11 = true;
      }
      if (bVar11 != false) {
        RVar9 = (pEVar7->computed_values).rare;
        uVar4 = (pEVar7->computed_values).rare.transform_origin_x;
        uVar6 = (pEVar7->computed_values).rare.transform_origin_y;
        uVar22 = -(uint)(((undefined1  [80])RVar9 & (undefined1  [80])0x40) == (undefined1  [80])0x0
                        );
        uVar23 = -(uint)(((undefined1  [80])RVar9 & (undefined1  [80])0x80) == (undefined1  [80])0x0
                        );
        local_108._0_8_ =
             CONCAT44(~uVar23 & (uint)(fStack_1d4 * (float)uVar6 * 0.01 + fStack_1b4),
                      ~uVar22 & (uint)(local_1d8 * (float)uVar4 * 0.01 + local_1b8)) |
             CONCAT44((uint)(fStack_1b4 + (float)uVar6) & uVar23,
                      (uint)(local_1b8 + (float)uVar4) & uVar22);
        local_108.z = (pEVar7->computed_values).rare.transform_origin_z;
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Translate(&local_f8,&local_108);
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
        MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
        Multiply(&local_70,&local_f8,&perspective);
        local_118._0_8_ = local_108._0_8_ ^ 0x8000000080000000;
        local_118._8_4_ = -local_108.z;
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Translate
                  (&local_b0,(Vector3<float> *)local_118);
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
        MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
        Multiply(&matrix,&local_70,&local_b0);
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator=(&perspective,&matrix);
      }
    }
    pUVar2 = &this->transform_state;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&transform_ptr.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((this->parent == (Element *)0x0) ||
       (pTVar17 = (this->parent->transform_state)._M_t.
                  super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                  .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl,
       pTVar17 == (TransformState *)0x0)) {
LAB_0027f5c7:
      if (bVar11 != false) goto LAB_0027f5cd;
      pTVar17 = (pUVar2->_M_t).
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar17 != (TransformState *)0x0) {
        TransformState::SetTransform(pTVar17,(Matrix4f *)0x0);
      }
    }
    else {
      pMVar15 = TransformState::GetLocalPerspective(pTVar17);
      if (pMVar15 != (Matrix4f *)0x0) {
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
        MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
        Multiply(&matrix,pMVar15,&perspective);
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator=(&perspective,&matrix);
        bVar11 = true;
      }
      pMVar15 = TransformState::GetTransform(pTVar17);
      if (pMVar15 == (Matrix4f *)0x0) goto LAB_0027f5c7;
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
      MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
      Multiply(&matrix,pMVar15,&perspective);
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator=(&perspective,&matrix);
      bVar11 = true;
LAB_0027f5cd:
      pTVar17 = (pUVar2->_M_t).
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar17 == (TransformState *)0x0) {
        ::std::make_unique<Rml::TransformState>();
        uVar10 = matrix.vectors[0]._0_8_;
        matrix.vectors[0].x = 0.0;
        matrix.vectors[0].y = 0.0;
        ::std::__uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
        reset((__uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
              pUVar2,(pointer)uVar10);
        ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
        ~unique_ptr((unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
                    &matrix);
        pTVar17 = (pUVar2->_M_t).
                  super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                  .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      }
      bVar13 = TransformState::SetTransform(pTVar17,&perspective);
      bVar18 = bVar18 | bVar13;
    }
    if ((bVar18 == 0) && (bVar19 == bVar11)) goto LAB_0027f62c;
  }
  for (uVar16 = 0;
      puVar8 = (this->children).
               super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(this->children).
                             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3);
      uVar16 = uVar16 + 1) {
    pbVar1 = (byte *)((long)puVar8[uVar16]._M_t.
                            super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t +
                     0x17);
    *pbVar1 = *pbVar1 | 0x20;
  }
LAB_0027f62c:
  pTVar17 = (this->transform_state)._M_t.
            super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
            .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
  if ((pTVar17 != (TransformState *)0x0) &&
     (pMVar15 = TransformState::GetTransform(pTVar17), pMVar15 == (Matrix4f *)0x0)) {
    pMVar15 = TransformState::GetLocalPerspective
                        ((this->transform_state)._M_t.
                         super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                         .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl);
    if (pMVar15 == (Matrix4f *)0x0) {
      ::std::__uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::reset
                ((__uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
                 &this->transform_state,(pointer)0x0);
    }
  }
  return;
}

Assistant:

void Element::UpdateTransformState()
{
	if (!dirty_perspective && !dirty_transform)
		return;

	const ComputedValues& computed = meta->computed_values;

	const Vector2f pos = GetAbsoluteOffset(BoxArea::Border);
	const Vector2f size = GetBox().GetSize(BoxArea::Border);

	bool perspective_or_transform_changed = false;

	if (dirty_perspective)
	{
		// If perspective is set on this element, then it applies to our children. We just calculate it here,
		// and let the children's transform update merge it with their transform.
		bool had_perspective = (transform_state && transform_state->GetLocalPerspective());

		float distance = computed.perspective();
		Vector2f vanish = Vector2f(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f);
		bool have_perspective = false;

		if (distance > 0.0f)
		{
			have_perspective = true;

			// Compute the vanishing point from the perspective origin
			if (computed.perspective_origin_x().type == Style::PerspectiveOrigin::Percentage)
				vanish.x = pos.x + computed.perspective_origin_x().value * 0.01f * size.x;
			else
				vanish.x = pos.x + computed.perspective_origin_x().value;

			if (computed.perspective_origin_y().type == Style::PerspectiveOrigin::Percentage)
				vanish.y = pos.y + computed.perspective_origin_y().value * 0.01f * size.y;
			else
				vanish.y = pos.y + computed.perspective_origin_y().value;
		}

		if (have_perspective)
		{
			// Equivalent to: Translate(x,y,0) * Perspective(distance) * Translate(-x,-y,0)
			Matrix4f perspective = Matrix4f::FromRows( //
				{1, 0, -vanish.x / distance, 0},       //
				{0, 1, -vanish.y / distance, 0},       //
				{0, 0, 1, 0},                          //
				{0, 0, -1 / distance, 1}               //
			);

			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetLocalPerspective(&perspective);
		}
		else if (transform_state)
			transform_state->SetLocalPerspective(nullptr);

		perspective_or_transform_changed |= (have_perspective != had_perspective);

		dirty_perspective = false;
	}

	if (dirty_transform)
	{
		// We want to find the accumulated transform given all our ancestors. It is assumed here that the parent transform is already updated,
		// so that we only need to consider our local transform and combine it with our parent's transform and perspective matrices.
		bool had_transform = (transform_state && transform_state->GetTransform());

		bool have_transform = false;
		Matrix4f transform = Matrix4f::Identity();

		if (TransformPtr transform_ptr = computed.transform())
		{
			// First find the current element's transform
			const int n = transform_ptr->GetNumPrimitives();
			for (int i = 0; i < n; ++i)
			{
				const TransformPrimitive& primitive = transform_ptr->GetPrimitive(i);
				Matrix4f matrix = TransformUtilities::ResolveTransform(primitive, *this);
				transform *= matrix;
				have_transform = true;
			}

			if (have_transform)
			{
				// Compute the transform origin
				Vector3f transform_origin(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f, 0);

				if (computed.transform_origin_x().type == Style::TransformOrigin::Percentage)
					transform_origin.x = pos.x + computed.transform_origin_x().value * size.x * 0.01f;
				else
					transform_origin.x = pos.x + computed.transform_origin_x().value;

				if (computed.transform_origin_y().type == Style::TransformOrigin::Percentage)
					transform_origin.y = pos.y + computed.transform_origin_y().value * size.y * 0.01f;
				else
					transform_origin.y = pos.y + computed.transform_origin_y().value;

				transform_origin.z = computed.transform_origin_z();

				// Make the transformation apply relative to the transform origin
				transform = Matrix4f::Translate(transform_origin) * transform * Matrix4f::Translate(-transform_origin);
			}

			// We may want to include the local offsets here, as suggested by the CSS specs, so that the local transform is applied after the offset I
			// believe the motivation is. Then we would need to subtract the absolute zero-offsets during geometry submit whenever we have transforms.
		}

		if (parent && parent->transform_state)
		{
			// Apply the parent's local perspective and transform.
			// @performance: If we have no local transform and no parent perspective, we can effectively just point to the parent transform instead of
			// copying it.
			const TransformState& parent_state = *parent->transform_state;

			if (auto parent_perspective = parent_state.GetLocalPerspective())
			{
				transform = *parent_perspective * transform;
				have_transform = true;
			}

			if (auto parent_transform = parent_state.GetTransform())
			{
				transform = *parent_transform * transform;
				have_transform = true;
			}
		}

		if (have_transform)
		{
			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetTransform(&transform);
		}
		else if (transform_state)
			transform_state->SetTransform(nullptr);

		perspective_or_transform_changed |= (had_transform != have_transform);
	}

	// A change in perspective or transform will require an update to children transforms as well.
	if (perspective_or_transform_changed)
	{
		for (size_t i = 0; i < children.size(); i++)
			children[i]->DirtyTransformState(false, true);
	}

	// No reason to keep the transform state around if transform and perspective have been removed.
	if (transform_state && !transform_state->GetTransform() && !transform_state->GetLocalPerspective())
	{
		transform_state.reset();
	}
}